

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_xu_index.c
# Opt level: O2

int dwarf_get_debugfission_for_key
              (Dwarf_Debug dbg,Dwarf_Sig8 *key,char *key_type,Dwarf_Debug_Fission_Per_CU *percu_out,
              Dwarf_Error *error)

{
  ulong v;
  ulong v_00;
  ulong uVar1;
  Dwarf_Xu_Index_Header xuhdr_00;
  int iVar2;
  char *pcVar3;
  Dwarf_Signed errval;
  dwarfstring_u v_01;
  Dwarf_Unsigned index;
  Dwarf_Sig8 hashentry_key;
  Dwarf_Xu_Index_Header xuhdr;
  Dwarf_Unsigned percu_index;
  ulong local_60;
  undefined8 local_58;
  dwarfstring s;
  
  xuhdr = (Dwarf_Xu_Index_Header)0x0;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    pcVar3 = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_debugfission_for_key()either null or it containsa stale Dwarf_Debug pointer"
    ;
    errval = 0x51;
  }
  else {
    if ((key_type != (char *)0x0 && key != (Dwarf_Sig8 *)0x0) &&
        percu_out != (Dwarf_Debug_Fission_Per_CU *)0x0) {
      iVar2 = _dwarf_load_debug_info(dbg,error);
      if (iVar2 == 1) {
        return 1;
      }
      iVar2 = _dwarf_load_debug_types(dbg,error);
      if (iVar2 == 1) {
        return 1;
      }
      iVar2 = _dwarf_get_xuhdr(dbg,key_type,&xuhdr,error);
      xuhdr_00 = xuhdr;
      if (iVar2 != 0) {
        return iVar2;
      }
      v_00 = xuhdr->gx_slots_in_hash;
      percu_index = 0;
      hashentry_key.signature[0] = '\0';
      hashentry_key.signature[1] = '\0';
      hashentry_key.signature[2] = '\0';
      hashentry_key.signature[3] = '\0';
      hashentry_key.signature[4] = '\0';
      hashentry_key.signature[5] = '\0';
      hashentry_key.signature[6] = '\0';
      hashentry_key.signature[7] = '\0';
      uVar1 = xuhdr->gx_section_length;
      if (uVar1 < v_00) {
        dwarfstring_constructor(&s);
        dwarfstring_append_printf_u
                  (&s,"ERROR: DW_DLE_XU_NAME_COL_ERROR as the slots count of %u ",v_00);
        v_01 = xuhdr_00->gx_section_length;
      }
      else {
        if (v_00 == 0) {
          return -1;
        }
        v = v_00 * 4;
        if (v < uVar1 || v - uVar1 == 0) {
          local_58 = 0;
          local_60 = v_00;
          (*dbg->de_copy_word)(&local_58,key,8);
          index = 0;
          while( true ) {
            if (local_60 == index) {
              return -1;
            }
            iVar2 = dwarf_get_xu_hash_entry(xuhdr_00,index,&hashentry_key,&percu_index,error);
            if (iVar2 != 0) break;
            if ((hashentry_key.signature != (char  [8])0x0 || percu_index != 0) &&
               (*&key->signature == hashentry_key.signature)) {
              iVar2 = transform_xu_to_dfp(xuhdr_00,percu_index,key,key_type,percu_out,error);
              return iVar2;
            }
            index = index + 1;
          }
          return iVar2;
        }
        dwarfstring_constructor(&s);
        dwarfstring_append_printf_u
                  (&s,"ERROR: DW_DLE_XU_NAME_COL_ERROR as the slots count *4 of %u ",v);
        v_01 = xuhdr_00->gx_section_length;
      }
      dwarfstring_append_printf_u(&s," is too high. given the section length of %u\n",v_01);
      pcVar3 = dwarfstring_string(&s);
      _dwarf_error_string(dbg,error,0x10e,pcVar3);
      dwarfstring_destructor(&s);
      return 1;
    }
    pcVar3 = 
    "DW_DLE_XU_TYPE_ARG_ERROR: dw_key, dw_keytype, or Dwarf_Debug_Fission_Per_CU pointer* to return is not valid"
    ;
    errval = 0x10c;
  }
  _dwarf_error_string((Dwarf_Debug)0x0,error,errval,pcVar3);
  return 1;
}

Assistant:

int
dwarf_get_debugfission_for_key(Dwarf_Debug dbg,
    Dwarf_Sig8  *key  /* pointer to hash signature */,
    const char  *key_type  /*  "cu" or "tu" */,
    Dwarf_Debug_Fission_Per_CU *  percu_out,
    Dwarf_Error *error)
{
    int sres = 0;
    Dwarf_Unsigned percu_index = 0;
    Dwarf_Xu_Index_Header xuhdr = 0;

    CHECK_DBG(dbg,error,"dwarf_get_debugfission_for_key()");
    if (!key || !key_type || !percu_out) {
        _dwarf_error_string(0,error,DW_DLE_XU_TYPE_ARG_ERROR,
            "DW_DLE_XU_TYPE_ARG_ERROR: dw_key, dw_keytype, or "
            "Dwarf_Debug_Fission_Per_CU pointer* to return "
            "is not valid");
        return DW_DLV_ERROR;
    }

    sres = _dwarf_load_debug_info(dbg,error);
    if (sres == DW_DLV_ERROR) {
        return sres;
    }
    sres = _dwarf_load_debug_types(dbg,error);
    if (sres == DW_DLV_ERROR) {
        return sres;
    }
    /*  Returns already existing xuhdr */
    sres = _dwarf_get_xuhdr(dbg,key_type, &xuhdr,error);
    if (sres != DW_DLV_OK) {
        return sres;
    }
    /*  Search in that xu data. */
    sres = _dwarf_search_fission_for_key(dbg,
        xuhdr,key,&percu_index,error);
    if (sres != DW_DLV_OK) {
        return sres;
    }
    sres = transform_xu_to_dfp(xuhdr,percu_index,key,
        key_type,percu_out,error);
    return sres;
}